

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_sse4.c
# Opt level: O2

void av1_fwd_txfm2d_8x4_sse4_1(int16_t *input,int32_t *coeff,int stride,TX_TYPE tx_type,int bd)

{
  code *pcVar1;
  code *pcVar2;
  int8_t *piVar3;
  int iVar4;
  undefined7 in_register_00000009;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  __m128i *in_00;
  __m128i in [8];
  
  piVar3 = av1_fwd_txfm_shift_ls[6];
  iVar4 = (int)CONCAT71(in_register_00000009,tx_type);
  uVar5 = iVar4 - 4;
  uVar8 = (ulong)(uint)(iVar4 << 3);
  iVar4 = 0;
  uVar7 = 0;
  if ((byte)uVar5 < 0xc) {
    uVar5 = (uVar5 & 0xff) << 2;
    iVar4 = *(int *)(&DAT_004c1a9c + uVar5);
    uVar7 = (ulong)*(uint *)(&DAT_004c1acc + uVar5);
  }
  pcVar1 = *(code **)((long)col_highbd_txfm4x4_arr + uVar8);
  pcVar2 = *(code **)((long)row_highbd_txfm4x8_arr + uVar8);
  load_buffer_8x4(input,in,stride,iVar4,(int)uVar7,(int)*av1_fwd_txfm_shift_ls[6]);
  for (lVar6 = 0; iVar4 = (int)uVar7, lVar6 != 0x80; lVar6 = lVar6 + 0x40) {
    in_00 = (__m128i *)((long)in[0] + lVar6);
    (*pcVar1)(in_00,in_00,0xd,1);
    transpose_32bit_4x4(in_00,in_00);
  }
  col_txfm_4x8_rounding(in,-(int)piVar3[1]);
  (*pcVar2)(in,coeff,0xd,1);
  av1_round_shift_rect_array_32_sse4_1((__m128i *)coeff,(__m128i *)coeff,8,-(int)piVar3[2],iVar4);
  return;
}

Assistant:

void av1_fwd_txfm2d_8x4_sse4_1(const int16_t *input, int32_t *coeff, int stride,
                               TX_TYPE tx_type, int bd) {
  __m128i in[8];
  __m128i *outcoeff128 = (__m128i *)coeff;
  const int8_t *shift = av1_fwd_txfm_shift_ls[TX_8X4];
  const int txw_idx = get_txw_idx(TX_8X4);
  const int txh_idx = get_txh_idx(TX_8X4);
  const int txfm_size_col = tx_size_wide[TX_8X4];
  const int txfm_size_row = tx_size_high[TX_8X4];
  int bitcol = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  int bitrow = av1_fwd_cos_bit_row[txw_idx][txh_idx];
  const fwd_transform_1d_sse4_1 col_txfm = col_highbd_txfm4x4_arr[tx_type];
  const fwd_transform_1d_sse4_1 row_txfm = row_highbd_txfm4x8_arr[tx_type];
  int ud_flip, lr_flip;
  get_flip_cfg(tx_type, &ud_flip, &lr_flip);
  // col tranform
  load_buffer_8x4(input, in, stride, ud_flip, lr_flip, shift[0]);
  for (int i = 0; i < 2; i++) {
    __m128i *cur_in = &in[i * txfm_size_row];
    col_txfm(cur_in, cur_in, bitcol, 1);
    transpose_32bit_4x4(cur_in, cur_in);
  }
  col_txfm_4x8_rounding(in, -shift[1]);

  // row tranform
  row_txfm(in, outcoeff128, bitrow, 1);
  av1_round_shift_rect_array_32_sse4_1(outcoeff128, outcoeff128, txfm_size_col,
                                       -shift[2], NewSqrt2);
  (void)bd;
}